

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs::method_base_*,_std::allocator>::resize
          (stack_type<cs::method_base_*,_std::allocator> *this,size_t size)

{
  type *ptVar1;
  
  if (this->m_data != (aligned_type *)0x0) {
    destroy(this);
  }
  this->m_size = size;
  ptVar1 = __gnu_cxx::new_allocator<std::aligned_storage<8UL,_8UL>::type>::allocate
                     ((new_allocator<std::aligned_storage<8UL,_8UL>::type> *)&this->field_0x10,size,
                      (void *)0x0);
  this->m_data = ptVar1;
  this->m_start = (method_base **)ptVar1;
  this->m_current = (method_base **)ptVar1;
  return;
}

Assistant:

void resize(std::size_t size)
		{
			if (m_data != nullptr)
				destroy();
			m_size = size;
			m_data = m_alloc.allocate(m_size);
			m_start = reinterpret_cast<T *>(m_data);
			m_current = m_start;
		}